

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O0

int Aig_ManScanMapping_rec(Cnf_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vMapped)

{
  int iVar1;
  ulong uVar2;
  Vec_Ptr_t *vSuper_00;
  Aig_Obj_t *pAVar3;
  Dar_Cut_t *pCut;
  Vec_Ptr_t *vSuper;
  int i;
  int aArea;
  Dar_Cut_t *pCutBest;
  Aig_Obj_t *pLeaf;
  Vec_Ptr_t *vMapped_local;
  Aig_Obj_t *pObj_local;
  Cnf_Man_t *p_local;
  
  uVar2 = *(ulong *)&pObj->field_0x18 >> 6;
  *(ulong *)&pObj->field_0x18 =
       *(ulong *)&pObj->field_0x18 & 0xffffffff0000003f |
       ((ulong)(((uint)uVar2 & 0x3ffffff) + 1) & 0x3ffffff) << 6;
  if ((((uVar2 & 0x3ffffff) == 0) && (iVar1 = Aig_ObjIsCi(pObj), iVar1 == 0)) &&
     (iVar1 = Aig_ObjIsConst1(pObj), iVar1 == 0)) {
    iVar1 = Aig_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfUtil.c"
                    ,0x35,"int Aig_ManScanMapping_rec(Cnf_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    if (vMapped != (Vec_Ptr_t *)0x0) {
      Vec_PtrPush(vMapped,pObj);
    }
    if ((*(ulong *)&pObj->field_0x18 >> 5 & 1) == 0) {
      pCut = Dar_ObjBestCut(pObj);
      vSuper._4_4_ = Cnf_CutSopCost(p,pCut);
      for (vSuper._0_4_ = 0; (int)vSuper < (int)(*(uint *)&pCut->field_0x4 >> 0x1d);
          vSuper._0_4_ = (int)vSuper + 1) {
        pAVar3 = Aig_ManObj(p->pManAig,pCut->pLeaves[(int)vSuper]);
        iVar1 = Aig_ManScanMapping_rec(p,pAVar3,vMapped);
        vSuper._4_4_ = iVar1 + vSuper._4_4_;
      }
    }
    else {
      vSuper_00 = Vec_PtrAlloc(100);
      Aig_ObjCollectSuper(pObj,vSuper_00);
      iVar1 = Vec_PtrSize(vSuper_00);
      vSuper._4_4_ = iVar1 + 1;
      for (vSuper._0_4_ = 0; iVar1 = Vec_PtrSize(vSuper_00), (int)vSuper < iVar1;
          vSuper._0_4_ = (int)vSuper + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vSuper_00,(int)vSuper);
        pAVar3 = Aig_Regular(pAVar3);
        iVar1 = Aig_ManScanMapping_rec(p,pAVar3,vMapped);
        vSuper._4_4_ = iVar1 + vSuper._4_4_;
      }
      Vec_PtrFree(vSuper_00);
      *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffdf | 0x20;
    }
    p_local._4_4_ = vSuper._4_4_;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes area, references, and nodes used in the mapping.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Aig_ManScanMapping_rec( Cnf_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vMapped )
{
    Aig_Obj_t * pLeaf;
    Dar_Cut_t * pCutBest;
    int aArea, i;
    if ( pObj->nRefs++ || Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return 0;
    assert( Aig_ObjIsAnd(pObj) );
    // collect the node first to derive pre-order
    if ( vMapped )
        Vec_PtrPush( vMapped, pObj );
    // visit the transitive fanin of the selected cut
    if ( pObj->fMarkB )
    {
        Vec_Ptr_t * vSuper = Vec_PtrAlloc( 100 );
        Aig_ObjCollectSuper( pObj, vSuper );
        aArea = Vec_PtrSize(vSuper) + 1;
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pLeaf, i )
            aArea += Aig_ManScanMapping_rec( p, Aig_Regular(pLeaf), vMapped );
        Vec_PtrFree( vSuper );
        ////////////////////////////
        pObj->fMarkB = 1;
    }
    else
    {
        pCutBest = Dar_ObjBestCut( pObj );
        aArea = Cnf_CutSopCost( p, pCutBest );
        Dar_CutForEachLeaf( p->pManAig, pCutBest, pLeaf, i )
            aArea += Aig_ManScanMapping_rec( p, pLeaf, vMapped );
    }
    return aArea;
}